

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O0

void __thiscall LLVMBC::LLVMContext::allocate_new_chain(LLVMContext *this,size_t size,size_t align)

{
  void *local_30;
  void *ptr;
  size_t min_size;
  size_t align_local;
  size_t size_local;
  LLVMContext *this_local;
  
  ptr = (void *)(size + align);
  if (ptr < (void *)0x10000) {
    ptr = (void *)0x10000;
  }
  min_size = align;
  align_local = size;
  size_local = (size_t)this;
  local_30 = dxil_spv::allocate_in_thread((size_t)ptr);
  if (local_30 == (void *)0x0) {
    this->current_block = 0;
    this->current_block_end = 0;
  }
  else {
    std::vector<void_*,_dxil_spv::ThreadLocalAllocator<void_*>_>::push_back
              (&this->raw_allocations,&local_30);
    this->current_block = (uintptr_t)local_30;
    this->current_block_end = this->current_block + (long)ptr;
  }
  return;
}

Assistant:

void LLVMContext::allocate_new_chain(size_t size, size_t align)
{
	size_t min_size = size + align;
	if (min_size < 64 * 1024)
		min_size = 64 * 1024;

	void *ptr = dxil_spv::allocate_in_thread(min_size);
	if (ptr)
	{
		raw_allocations.push_back(ptr);
		current_block = reinterpret_cast<uintptr_t>(ptr);
		current_block_end = current_block + min_size;
	}
	else
	{
		current_block = 0;
		current_block_end = 0;
	}
}